

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cc
# Opt level: O0

FilterPolicy * leveldb::NewBloomFilterPolicy(int bits_per_key)

{
  long lVar1;
  BloomFilterPolicy *this;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (BloomFilterPolicy *)operator_new(0x18);
  anon_unknown_1::BloomFilterPolicy::BloomFilterPolicy(this,in_stack_ffffffffffffffd4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &this->super_FilterPolicy;
  }
  __stack_chk_fail();
}

Assistant:

const FilterPolicy* NewBloomFilterPolicy(int bits_per_key) {
  return new BloomFilterPolicy(bits_per_key);
}